

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O3

Constant *
spvtools::opt::anon_unknown_0::FoldMax
          (Type *result_type,Constant *a,Constant *b,ConstantManager *param_4)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar7;
  int64_t iVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  long lVar6;
  
  iVar1 = (*result_type->_vptr_Type[10])();
  lVar6 = CONCAT44(extraout_var,iVar1);
  if (lVar6 == 0) {
    iVar1 = (*result_type->_vptr_Type[0xc])(result_type);
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      return (Constant *)0x0;
    }
    iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0x24);
    if (iVar1 == 0x40) {
      dVar16 = analysis::Constant::GetDouble(a);
      dVar17 = analysis::Constant::GetDouble(b);
      bVar11 = dVar16 == dVar17;
      bVar12 = dVar16 < dVar17;
    }
    else {
      if (iVar1 != 0x20) {
        return (Constant *)0x0;
      }
      fVar14 = analysis::Constant::GetFloat(a);
      fVar15 = analysis::Constant::GetFloat(b);
      bVar11 = fVar14 == fVar15;
      bVar12 = fVar14 < fVar15;
    }
  }
  else if (*(int *)(lVar6 + 0x24) == 0x40) {
    if (*(char *)(lVar6 + 0x28) == '\x01') {
      iVar7 = analysis::Constant::GetS64(a);
      iVar8 = analysis::Constant::GetS64(b);
      bVar13 = SBORROW8(iVar7,iVar8);
      bVar12 = iVar7 - iVar8 < 0;
      bVar11 = iVar7 == iVar8;
      goto LAB_005757f5;
    }
    uVar9 = analysis::Constant::GetU64(a);
    uVar10 = analysis::Constant::GetU64(b);
    bVar12 = uVar9 < uVar10;
    bVar11 = uVar9 == uVar10;
  }
  else {
    if (*(int *)(lVar6 + 0x24) != 0x20) {
      return (Constant *)0x0;
    }
    if (*(char *)(lVar6 + 0x28) == '\x01') {
      iVar2 = analysis::Constant::GetS32(a);
      iVar3 = analysis::Constant::GetS32(b);
      bVar13 = SBORROW4(iVar2,iVar3);
      bVar12 = iVar2 - iVar3 < 0;
      bVar11 = iVar2 == iVar3;
LAB_005757f5:
      if (!bVar11 && bVar13 == bVar12) {
        return a;
      }
      return b;
    }
    uVar4 = analysis::Constant::GetU32(a);
    uVar5 = analysis::Constant::GetU32(b);
    bVar12 = uVar4 < uVar5;
    bVar11 = uVar4 == uVar5;
  }
  if (!bVar12 && !bVar11) {
    b = a;
  }
  return b;
}

Assistant:

const analysis::Constant* FoldMax(const analysis::Type* result_type,
                                  const analysis::Constant* a,
                                  const analysis::Constant* b,
                                  analysis::ConstantManager*) {
  if (const analysis::Integer* int_type = result_type->AsInteger()) {
    if (int_type->width() == 32) {
      if (int_type->IsSigned()) {
        int32_t va = a->GetS32();
        int32_t vb = b->GetS32();
        return (va > vb ? a : b);
      } else {
        uint32_t va = a->GetU32();
        uint32_t vb = b->GetU32();
        return (va > vb ? a : b);
      }
    } else if (int_type->width() == 64) {
      if (int_type->IsSigned()) {
        int64_t va = a->GetS64();
        int64_t vb = b->GetS64();
        return (va > vb ? a : b);
      } else {
        uint64_t va = a->GetU64();
        uint64_t vb = b->GetU64();
        return (va > vb ? a : b);
      }
    }
  } else if (const analysis::Float* float_type = result_type->AsFloat()) {
    if (float_type->width() == 32) {
      float va = a->GetFloat();
      float vb = b->GetFloat();
      return (va > vb ? a : b);
    } else if (float_type->width() == 64) {
      double va = a->GetDouble();
      double vb = b->GetDouble();
      return (va > vb ? a : b);
    }
  }
  return nullptr;
}